

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::setCapacity
          (Vector<capnp::Orphan<capnp::json::Value::Field>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> newBuilder;
  ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::Orphan<capnp::json::Value::Field>>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>>::
  addAll<kj::ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>>>
            ((ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>> *)&local_30,&this->builder);
  ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }